

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

option_set * nonius::detail::command_line_options(void)

{
  int iVar1;
  long lVar2;
  initializer_list<nonius::detail::option> __l;
  allocator_type local_fd6;
  allocator local_fd5;
  allocator local_fd4;
  allocator local_fd3;
  allocator local_fd2;
  allocator local_fd1;
  allocator local_fd0;
  allocator local_fcf;
  allocator local_fce;
  allocator local_fcd;
  allocator local_fcc;
  allocator local_fcb;
  allocator local_fca;
  allocator local_fc9;
  allocator local_fc8;
  allocator local_fc7;
  allocator local_fc6;
  allocator local_fc5;
  allocator local_fc4;
  allocator local_fc3;
  allocator local_fc2;
  allocator local_fc1;
  allocator local_fc0;
  allocator local_fbf;
  allocator local_fbe;
  allocator local_fbd;
  allocator local_fbc;
  allocator local_fbb;
  allocator local_fba;
  allocator local_fb9;
  allocator local_fb8;
  allocator local_fb7;
  allocator local_fb6;
  allocator local_fb5;
  allocator local_fb4;
  allocator local_fb3;
  allocator local_fb2;
  allocator local_fb1;
  allocator local_fb0;
  allocator local_faf;
  allocator local_fae;
  allocator local_fad;
  allocator local_fac;
  allocator local_fab;
  allocator local_faa;
  allocator local_fa9;
  allocator local_fa8;
  allocator local_fa7;
  allocator local_fa6;
  allocator local_fa5;
  allocator local_fa4;
  allocator local_fa3;
  allocator local_fa2;
  allocator local_fa1;
  string local_fa0;
  string local_f80;
  string local_f60;
  string local_f40;
  string local_f20;
  string local_f00;
  string local_ee0;
  string local_ec0;
  string local_ea0;
  string local_e80;
  string local_e60;
  string local_e40;
  string local_e20;
  string local_e00;
  string local_de0;
  string local_dc0;
  string local_da0;
  string local_d80;
  string local_d60;
  string local_d40;
  string local_d20;
  string local_d00;
  string local_ce0;
  string local_cc0;
  string local_ca0;
  string local_c80;
  string local_c60;
  string local_c40;
  string local_c20;
  string local_c00;
  string local_be0;
  string local_bc0;
  string local_ba0;
  string local_b80;
  string local_b60;
  string local_b40;
  string local_b20;
  string local_b00;
  string local_ae0;
  string local_ac0;
  string local_aa0;
  string local_a80;
  string local_a60;
  string local_a40;
  string local_a20;
  string local_a00;
  string local_9e0;
  string local_9c0;
  string local_9a0;
  string local_980;
  string local_960;
  string local_940;
  string local_920;
  string local_900;
  string local_8e0;
  string local_8c0;
  string local_8a0;
  string local_880;
  string local_860;
  string local_840;
  option local_820 [4];
  option local_600;
  option local_578;
  option local_4f0;
  option local_468;
  option local_3e0;
  option local_358;
  option local_2d0;
  option local_248;
  option local_1c0;
  option local_138;
  option local_b0;
  
  if (command_line_options()::the_options == '\0') {
    iVar1 = __cxa_guard_acquire(&command_line_options()::the_options);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_840,"help",&local_fa1);
      std::__cxx11::string::string((string *)&local_860,"h",&local_fa2);
      std::__cxx11::string::string((string *)&local_880,"show this help message",&local_fa3);
      local_8a0._M_dataplus._M_p = (pointer)&local_8a0.field_2;
      local_8a0._M_string_length = 0;
      local_8a0.field_2._M_local_buf[0] = '\0';
      option::option(local_820,&local_840,&local_860,&local_880,&local_8a0,false);
      std::__cxx11::string::string((string *)&local_8c0,"samples",&local_fa4);
      std::__cxx11::string::string((string *)&local_8e0,"s",&local_fa5);
      std::__cxx11::string::string
                ((string *)&local_900,"number of samples to collect (default: 100)",&local_fa6);
      std::__cxx11::string::string((string *)&local_920,"SAMPLES",&local_fa7);
      option::option(local_820 + 1,&local_8c0,&local_8e0,&local_900,&local_920,false);
      std::__cxx11::string::string((string *)&local_940,"resamples",&local_fa8);
      std::__cxx11::string::string((string *)&local_960,"rs",&local_fa9);
      std::__cxx11::string::string
                ((string *)&local_980,"number of resamples for the bootstrap (default: 100000)",
                 &local_faa);
      std::__cxx11::string::string((string *)&local_9a0,"RESAMPLES",&local_fab);
      option::option(local_820 + 2,&local_940,&local_960,&local_980,&local_9a0,false);
      std::__cxx11::string::string((string *)&local_9c0,"confidence-interval",&local_fac);
      std::__cxx11::string::string((string *)&local_9e0,"ci",&local_fad);
      std::__cxx11::string::string
                ((string *)&local_a00,
                 "confidence interval for the bootstrap (between 0 and 1, default: 0.95)",&local_fae
                );
      std::__cxx11::string::string((string *)&local_a20,"INTERVAL",&local_faf);
      option::option(local_820 + 3,&local_9c0,&local_9e0,&local_a00,&local_a20,false);
      std::__cxx11::string::string((string *)&local_a40,"param",&local_fb0);
      std::__cxx11::string::string((string *)&local_a60,"p",&local_fb1);
      std::__cxx11::string::string((string *)&local_a80,"set a benchmark parameter",&local_fb2);
      std::__cxx11::string::string((string *)&local_aa0,"PARAM",&local_fb3);
      option::option(&local_600,&local_a40,&local_a60,&local_a80,&local_aa0,false);
      std::__cxx11::string::string((string *)&local_ac0,"output",&local_fb4);
      std::__cxx11::string::string((string *)&local_ae0,"o",&local_fb5);
      std::__cxx11::string::string
                ((string *)&local_b00,"output file (default: <stdout>)",&local_fb6);
      std::__cxx11::string::string((string *)&local_b20,"FILE",&local_fb7);
      option::option(&local_578,&local_ac0,&local_ae0,&local_b00,&local_b20,false);
      std::__cxx11::string::string((string *)&local_b40,"reporter",&local_fb8);
      std::__cxx11::string::string((string *)&local_b60,"r",&local_fb9);
      std::__cxx11::string::string
                ((string *)&local_b80,"reporter to use (default: standard)",&local_fba);
      std::__cxx11::string::string((string *)&local_ba0,"REPORTER",&local_fbb);
      option::option(&local_4f0,&local_b40,&local_b60,&local_b80,&local_ba0,false);
      std::__cxx11::string::string((string *)&local_bc0,"title",&local_fbc);
      std::__cxx11::string::string((string *)&local_be0,"t",&local_fbd);
      std::__cxx11::string::string((string *)&local_c00,"set report title",&local_fbe);
      std::__cxx11::string::string((string *)&local_c20,"TITLE",&local_fbf);
      option::option(&local_468,&local_bc0,&local_be0,&local_c00,&local_c20,false);
      std::__cxx11::string::string((string *)&local_c40,"no-analysis",&local_fc0);
      std::__cxx11::string::string((string *)&local_c60,"A",&local_fc1);
      std::__cxx11::string::string
                ((string *)&local_c80,"perform only measurements; do not perform any analysis",
                 &local_fc2);
      local_ca0._M_dataplus._M_p = (pointer)&local_ca0.field_2;
      local_ca0._M_string_length = 0;
      local_ca0.field_2._M_local_buf[0] = '\0';
      option::option(&local_3e0,&local_c40,&local_c60,&local_c80,&local_ca0,false);
      std::__cxx11::string::string((string *)&local_cc0,"filter",&local_fc3);
      std::__cxx11::string::string((string *)&local_ce0,"f",&local_fc4);
      std::__cxx11::string::string
                ((string *)&local_d00,
                 "only run benchmarks whose name matches the regular expression pattern",&local_fc5)
      ;
      std::__cxx11::string::string((string *)&local_d20,"PATTERN",&local_fc6);
      option::option(&local_358,&local_cc0,&local_ce0,&local_d00,&local_d20,false);
      std::__cxx11::string::string((string *)&local_d40,"list",&local_fc7);
      std::__cxx11::string::string((string *)&local_d60,"l",&local_fc8);
      std::__cxx11::string::string((string *)&local_d80,"list benchmarks",&local_fc9);
      local_da0._M_dataplus._M_p = (pointer)&local_da0.field_2;
      local_da0._M_string_length = 0;
      local_da0.field_2._M_local_buf[0] = '\0';
      option::option(&local_2d0,&local_d40,&local_d60,&local_d80,&local_da0,false);
      std::__cxx11::string::string((string *)&local_dc0,"list-params",&local_fca);
      std::__cxx11::string::string((string *)&local_de0,"lp",&local_fcb);
      std::__cxx11::string::string((string *)&local_e00,"list available parameters",&local_fcc);
      local_e20._M_dataplus._M_p = (pointer)&local_e20.field_2;
      local_e20._M_string_length = 0;
      local_e20.field_2._M_local_buf[0] = '\0';
      option::option(&local_248,&local_dc0,&local_de0,&local_e00,&local_e20,false);
      std::__cxx11::string::string((string *)&local_e40,"list-reporters",&local_fcd);
      std::__cxx11::string::string((string *)&local_e60,"lr",&local_fce);
      std::__cxx11::string::string((string *)&local_e80,"list available reporters",&local_fcf);
      local_ea0._M_dataplus._M_p = (pointer)&local_ea0.field_2;
      local_ea0._M_string_length = 0;
      local_ea0.field_2._M_local_buf[0] = '\0';
      option::option(&local_1c0,&local_e40,&local_e60,&local_e80,&local_ea0,false);
      std::__cxx11::string::string((string *)&local_ec0,"verbose",&local_fd0);
      std::__cxx11::string::string((string *)&local_ee0,"v",&local_fd1);
      std::__cxx11::string::string
                ((string *)&local_f00,"show verbose output (mutually exclusive with -q)",&local_fd2)
      ;
      local_f20._M_dataplus._M_p = (pointer)&local_f20.field_2;
      local_f20._M_string_length = 0;
      local_f20.field_2._M_local_buf[0] = '\0';
      option::option(&local_138,&local_ec0,&local_ee0,&local_f00,&local_f20,false);
      std::__cxx11::string::string((string *)&local_f40,"summary",&local_fd3);
      std::__cxx11::string::string((string *)&local_f60,"q",&local_fd4);
      std::__cxx11::string::string
                ((string *)&local_f80,"show summary output (mutually exclusive with -v)",&local_fd5)
      ;
      local_fa0._M_dataplus._M_p = (pointer)&local_fa0.field_2;
      local_fa0._M_string_length = 0;
      local_fa0.field_2._M_local_buf[0] = '\0';
      option::option(&local_b0,&local_f40,&local_f60,&local_f80,&local_fa0,false);
      __l._M_len = 0xf;
      __l._M_array = local_820;
      std::vector<nonius::detail::option,_std::allocator<nonius::detail::option>_>::vector
                (&command_line_options::the_options,__l,&local_fd6);
      lVar2 = 0x770;
      do {
        option::~option((option *)((long)&local_820[0].long_form._M_dataplus._M_p + lVar2));
        lVar2 = lVar2 + -0x88;
      } while (lVar2 != -0x88);
      std::__cxx11::string::~string((string *)&local_fa0);
      std::__cxx11::string::~string((string *)&local_f80);
      std::__cxx11::string::~string((string *)&local_f60);
      std::__cxx11::string::~string((string *)&local_f40);
      std::__cxx11::string::~string((string *)&local_f20);
      std::__cxx11::string::~string((string *)&local_f00);
      std::__cxx11::string::~string((string *)&local_ee0);
      std::__cxx11::string::~string((string *)&local_ec0);
      std::__cxx11::string::~string((string *)&local_ea0);
      std::__cxx11::string::~string((string *)&local_e80);
      std::__cxx11::string::~string((string *)&local_e60);
      std::__cxx11::string::~string((string *)&local_e40);
      std::__cxx11::string::~string((string *)&local_e20);
      std::__cxx11::string::~string((string *)&local_e00);
      std::__cxx11::string::~string((string *)&local_de0);
      std::__cxx11::string::~string((string *)&local_dc0);
      std::__cxx11::string::~string((string *)&local_da0);
      std::__cxx11::string::~string((string *)&local_d80);
      std::__cxx11::string::~string((string *)&local_d60);
      std::__cxx11::string::~string((string *)&local_d40);
      std::__cxx11::string::~string((string *)&local_d20);
      std::__cxx11::string::~string((string *)&local_d00);
      std::__cxx11::string::~string((string *)&local_ce0);
      std::__cxx11::string::~string((string *)&local_cc0);
      std::__cxx11::string::~string((string *)&local_ca0);
      std::__cxx11::string::~string((string *)&local_c80);
      std::__cxx11::string::~string((string *)&local_c60);
      std::__cxx11::string::~string((string *)&local_c40);
      std::__cxx11::string::~string((string *)&local_c20);
      std::__cxx11::string::~string((string *)&local_c00);
      std::__cxx11::string::~string((string *)&local_be0);
      std::__cxx11::string::~string((string *)&local_bc0);
      std::__cxx11::string::~string((string *)&local_ba0);
      std::__cxx11::string::~string((string *)&local_b80);
      std::__cxx11::string::~string((string *)&local_b60);
      std::__cxx11::string::~string((string *)&local_b40);
      std::__cxx11::string::~string((string *)&local_b20);
      std::__cxx11::string::~string((string *)&local_b00);
      std::__cxx11::string::~string((string *)&local_ae0);
      std::__cxx11::string::~string((string *)&local_ac0);
      std::__cxx11::string::~string((string *)&local_aa0);
      std::__cxx11::string::~string((string *)&local_a80);
      std::__cxx11::string::~string((string *)&local_a60);
      std::__cxx11::string::~string((string *)&local_a40);
      std::__cxx11::string::~string((string *)&local_a20);
      std::__cxx11::string::~string((string *)&local_a00);
      std::__cxx11::string::~string((string *)&local_9e0);
      std::__cxx11::string::~string((string *)&local_9c0);
      std::__cxx11::string::~string((string *)&local_9a0);
      std::__cxx11::string::~string((string *)&local_980);
      std::__cxx11::string::~string((string *)&local_960);
      std::__cxx11::string::~string((string *)&local_940);
      std::__cxx11::string::~string((string *)&local_920);
      std::__cxx11::string::~string((string *)&local_900);
      std::__cxx11::string::~string((string *)&local_8e0);
      std::__cxx11::string::~string((string *)&local_8c0);
      std::__cxx11::string::~string((string *)&local_8a0);
      std::__cxx11::string::~string((string *)&local_880);
      std::__cxx11::string::~string((string *)&local_860);
      std::__cxx11::string::~string((string *)&local_840);
      __cxa_atexit(std::vector<nonius::detail::option,_std::allocator<nonius::detail::option>_>::
                   ~vector,&command_line_options::the_options,&__dso_handle);
      __cxa_guard_release(&command_line_options()::the_options);
    }
  }
  return &command_line_options::the_options;
}

Assistant:

inline detail::option_set const& command_line_options() {
            static detail::option_set the_options {
                detail::option("help", "h", "show this help message"),
                detail::option("samples", "s", "number of samples to collect (default: 100)", "SAMPLES"),
                detail::option("resamples", "rs", "number of resamples for the bootstrap (default: 100000)", "RESAMPLES"),
                detail::option("confidence-interval", "ci", "confidence interval for the bootstrap (between 0 and 1, default: 0.95)", "INTERVAL"),
                detail::option("param", "p", "set a benchmark parameter", "PARAM"),
                detail::option("output", "o", "output file (default: <stdout>)", "FILE"),
                detail::option("reporter", "r", "reporter to use (default: standard)", "REPORTER"),
                detail::option("title", "t", "set report title", "TITLE"),
                detail::option("no-analysis", "A", "perform only measurements; do not perform any analysis"),
                detail::option("filter", "f", "only run benchmarks whose name matches the regular expression pattern", "PATTERN"),
                detail::option("list", "l", "list benchmarks"),
                detail::option("list-params", "lp", "list available parameters"),
                detail::option("list-reporters", "lr", "list available reporters"),
                detail::option("verbose", "v", "show verbose output (mutually exclusive with -q)"),
                detail::option("summary", "q", "show summary output (mutually exclusive with -v)")
            };
            return the_options;
        }